

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

void __thiscall
pbrt::Sphere::Sphere
          (Sphere *this,Transform *renderFromObject,Transform *objectFromRender,
          bool reverseOrientation,Float radius,Float zMin,Float zMax,Float phiMax)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar10 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  
  auVar11._4_60_ = in_register_00001284;
  auVar11._0_4_ = zMax;
  auVar10._4_60_ = in_register_00001244;
  auVar10._0_4_ = zMin;
  auVar8._4_60_ = in_register_00001204;
  auVar8._0_4_ = radius;
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar7 = auVar8._0_16_;
  auVar5 = vxorps_avx512vl(auVar7,auVar1);
  auVar9 = vminss_avx(auVar11._0_16_,auVar10._0_16_);
  auVar1 = vmaxss_avx(auVar11._0_16_,auVar10._0_16_);
  this->radius = radius;
  auVar12 = vminss_avx(auVar7,auVar9);
  auVar7 = vminss_avx(auVar7,auVar1);
  uVar2 = vcmpss_avx512f(auVar9,auVar5,1);
  bVar4 = (bool)((byte)uVar2 & 1);
  uVar2 = vcmpss_avx512f(auVar1,auVar5,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  this->zMin = (Float)((uint)bVar4 * auVar5._0_4_ + (uint)!bVar4 * auVar12._0_4_);
  auVar12._0_4_ = auVar9._0_4_ / radius;
  auVar12._4_12_ = auVar9._4_12_;
  this->zMax = (Float)((uint)bVar3 * auVar5._0_4_ + (uint)!bVar3 * auVar7._0_4_);
  auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
  uVar2 = vcmpss_avx512f(auVar12,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar4 = (bool)((byte)uVar2 & 1);
  fVar6 = acosf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar9._0_4_));
  this->thetaZMin = fVar6;
  auVar9 = ZEXT416((uint)(auVar1._0_4_ / radius));
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
  uVar2 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar4 = (bool)((byte)uVar2 & 1);
  fVar6 = acosf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar1._0_4_));
  this->thetaZMax = fVar6;
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)phiMax));
  uVar2 = vcmpss_avx512f(ZEXT416((uint)phiMax),ZEXT816(0) << 0x40,1);
  this->phiMax = (Float)((uint)!(bool)((byte)uVar2 & 1) * (int)(auVar1._0_4_ * 0.017453292));
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar4 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar4;
  return;
}

Assistant:

Sphere(const Transform *renderFromObject, const Transform *objectFromRender,
           bool reverseOrientation, Float radius, Float zMin, Float zMax, Float phiMax)
        : renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          transformSwapsHandedness(renderFromObject->SwapsHandedness()),
          radius(radius),
          zMin(Clamp(std::min(zMin, zMax), -radius, radius)),
          zMax(Clamp(std::max(zMin, zMax), -radius, radius)),
          thetaZMin(std::acos(Clamp(std::min(zMin, zMax) / radius, -1, 1))),
          thetaZMax(std::acos(Clamp(std::max(zMin, zMax) / radius, -1, 1))),
          phiMax(Radians(Clamp(phiMax, 0, 360))) {}